

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preserve_unknown_enum_test.cc
# Opt level: O0

void __thiscall
google::protobuf::PreserveUnknownEnumTest_PreserveParseAndSerializeDynamicMessage_Test::
~PreserveUnknownEnumTest_PreserveParseAndSerializeDynamicMessage_Test
          (PreserveUnknownEnumTest_PreserveParseAndSerializeDynamicMessage_Test *this)

{
  PreserveUnknownEnumTest_PreserveParseAndSerializeDynamicMessage_Test *this_local;
  
  ~PreserveUnknownEnumTest_PreserveParseAndSerializeDynamicMessage_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PreserveUnknownEnumTest, PreserveParseAndSerializeDynamicMessage) {
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra orig_message;
  FillMessage(&orig_message);
  std::string serialized = orig_message.SerializeAsString();

  DynamicMessageFactory factory;
  std::unique_ptr<Message> message(
      factory
          .GetPrototype(
              proto3_preserve_unknown_enum_unittest::MyMessage::descriptor())
          ->New());
  EXPECT_EQ(true, message->ParseFromString(serialized));
  message->DiscardUnknownFields();

  serialized = message->SerializeAsString();
  EXPECT_EQ(true, orig_message.ParseFromString(serialized));
  CheckMessage(orig_message);
}